

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void setParams(int argc)

{
  int argc_local;
  
  if (argc < 5) {
    if (branching_strat == 4) {
      tuningParam1 = 0x19;
    }
    else if (branching_strat == 5) {
      tuningParam1 = 0x32;
    }
    else if (5 < branching_strat) {
      tuningParam1 = 2;
    }
  }
  if (argc < 6) {
    if (branching_strat == 4) {
      tuningParam2 = 0.1;
    }
    else if (branching_strat == 5) {
      tuningParam2 = 0.4;
    }
  }
  if (argc < 7) {
    if (branching_strat == 4) {
      tuningParam3 = 10;
    }
    else if (branching_strat == 5) {
      tuningParam3 = 3;
    }
  }
  branch_and_reduce_algorithm::BRANCHING = branching_strat;
  branch_and_reduce_algorithm::TUNING_PARAM1 = tuningParam1;
  branch_and_reduce_algorithm::TUNING_PARAM2 = tuningParam2;
  branch_and_reduce_algorithm::TUNING_PARAM3 = tuningParam3;
  return;
}

Assistant:

void setParams(int argc)
{
    if (argc < 5)
    {
        if (branching_strat == 4)
            tuningParam1 = 25;
        else if (branching_strat == 5)
            tuningParam1 = 50;
        else if (branching_strat >= 6)
            tuningParam1 = 2;
    }

    if (argc < 6)
    {
        if (branching_strat == 4)
            tuningParam2 = 0.1;
        else if (branching_strat == 5)
            tuningParam2 = 0.4;
    }

    if (argc < 7)
    {
        if (branching_strat == 4)
            tuningParam3 = 10;
        else if (branching_strat == 5)
            tuningParam3 = 3;
    }

    branch_and_reduce_algorithm::BRANCHING = branching_strat;
    branch_and_reduce_algorithm::TUNING_PARAM1 = tuningParam1;
    branch_and_reduce_algorithm::TUNING_PARAM2 = tuningParam2;
    branch_and_reduce_algorithm::TUNING_PARAM3 = tuningParam3;   
}